

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O2

void tool_help(void)

{
  char **ppcVar1;
  
  puts("Usage: curl [options...] <url>");
  for (ppcVar1 = &helptext[0].desc; ((helptxt *)(ppcVar1 + -1))->opt != (char *)0x0;
      ppcVar1 = ppcVar1 + 2) {
    printf(" %-19s %s\n",((helptxt *)(ppcVar1 + -1))->opt,*ppcVar1);
  }
  return;
}

Assistant:

void tool_help(void)
{
  int i;
  puts("Usage: curl [options...] <url>");
  for(i = 0; helptext[i].opt; i++) {
    printf(" %-19s %s\n", helptext[i].opt, helptext[i].desc);
#ifdef PRINT_LINES_PAUSE
    if(i && ((i % PRINT_LINES_PAUSE) == 0))
      tool_pressanykey();
#endif
  }
}